

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

void cf_aes_decrypt(cf_aes_context *ctx,uint8_t *in,uint8_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint x;
  uint x_00;
  ulong uVar4;
  uint32_t *puVar5;
  uint x_01;
  uint x_02;
  uint uVar6;
  uint32_t local_58;
  uint32_t local_54;
  uint32_t local_50;
  uint local_4c;
  uint32_t local_3c;
  uint8_t *local_38;
  
  uVar6 = ctx->rounds;
  uVar4 = (ulong)uVar6;
  local_38 = out;
  if ((uVar4 < 0xf) && ((0x5400U >> (uVar6 & 0x1f) & 1) != 0)) {
    local_3c = read32_be(in);
    uVar1 = read32_be(in + 4);
    uVar2 = read32_be(in + 8);
    uVar3 = read32_be(in + 0xc);
    local_58 = local_3c ^ ctx->ks[uVar4 * 4];
    local_54 = uVar1 ^ ctx->ks[uVar4 * 4 + 1];
    local_50 = uVar2 ^ ctx->ks[uVar4 * 4 + 2];
    local_4c = uVar3 ^ ctx->ks[uVar4 * 4 + 3];
    puVar5 = ctx->ks + uVar4 * 4 + -1;
    while( true ) {
      uVar6 = uVar6 - 1;
      inv_shift_rows(&local_58);
      inv_sub_block(&local_58);
      x = local_58 ^ puVar5[-3];
      x_00 = local_54 ^ puVar5[-2];
      x_02 = local_50 ^ ((cf_aes_context *)(puVar5 + -1))->rounds;
      x_01 = local_4c ^ *puVar5;
      if (uVar6 == 0) break;
      local_4c = x_01;
      local_58 = inv_mix_column(x);
      local_54 = inv_mix_column(x_00);
      local_50 = inv_mix_column(x_02);
      local_4c = inv_mix_column(x_01);
      puVar5 = puVar5 + -4;
    }
    *local_38 = (uint8_t)(x >> 0x18);
    local_38[1] = (uint8_t)(x >> 0x10);
    local_38[2] = (uint8_t)(x >> 8);
    local_38[3] = (uint8_t)x;
    local_38[4] = (uint8_t)(x_00 >> 0x18);
    local_38[5] = (uint8_t)(x_00 >> 0x10);
    local_38[6] = (uint8_t)(x_00 >> 8);
    local_38[7] = (uint8_t)x_00;
    local_38[8] = (uint8_t)(x_02 >> 0x18);
    local_38[9] = (uint8_t)(x_02 >> 0x10);
    local_38[10] = (uint8_t)(x_02 >> 8);
    local_38[0xb] = (uint8_t)x_02;
    local_38[0xc] = (uint8_t)(x_01 >> 0x18);
    local_38[0xd] = (uint8_t)(x_01 >> 0x10);
    local_38[0xe] = (uint8_t)(x_01 >> 8);
    local_38[0xf] = (uint8_t)x_01;
    return;
  }
  abort();
}

Assistant:

void cf_aes_decrypt(const cf_aes_context *ctx,
                    const uint8_t in[AES_BLOCKSZ],
                    uint8_t out[AES_BLOCKSZ])
{
  assert(ctx->rounds == AES128_ROUNDS ||
         ctx->rounds == AES192_ROUNDS ||
         ctx->rounds == AES256_ROUNDS);

  uint32_t state[4] = {
    read32_be(in + 0),
    read32_be(in + 4),
    read32_be(in + 8),
    read32_be(in + 12)
  };

  const uint32_t *round_keys = &ctx->ks[ctx->rounds << 2];
  add_round_key(state, round_keys);
  round_keys -= 4;

  uint32_t round;
  for (round = ctx->rounds - 1; round != 0; round--)
  {
    inv_shift_rows(state);
    inv_sub_block(state);
    add_round_key(state, round_keys);
    inv_mix_columns(state);
    round_keys -= 4;
  }

  inv_shift_rows(state);
  inv_sub_block(state);
  add_round_key(state, round_keys);
  
  write32_be(state[0], out + 0);
  write32_be(state[1], out + 4);
  write32_be(state[2], out + 8);
  write32_be(state[3], out + 12);
}